

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INetwork.cpp
# Opt level: O1

void __thiscall
INetwork::AddNeuron(INetwork *this,INeuron *neuronPtr,size_t neuronId,NEURON_TYPE neuronType)

{
  _Rb_tree_header *p_Var1;
  pointer *pppIVar2;
  mapped_type *ppIVar3;
  _Base_ptr p_Var4;
  vector<INeuron*,std::allocator<INeuron*>> *this_00;
  _Base_ptr p_Var5;
  iterator __position;
  INeuron *local_28;
  size_t local_20;
  
  p_Var1 = &(this->neuronMap)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (this->neuronMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[*(ulong *)(p_Var5 + 1) < neuronId]) {
    if (*(ulong *)(p_Var5 + 1) >= neuronId) {
      p_Var4 = p_Var5;
    }
  }
  p_Var5 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) && (p_Var5 = p_Var4, neuronId < *(ulong *)(p_Var4 + 1)))
  {
    p_Var5 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    return;
  }
  local_28 = neuronPtr;
  local_20 = neuronId;
  ppIVar3 = std::
            map<unsigned_long,_INeuron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_INeuron_*>_>_>
            ::operator[](&this->neuronMap,&local_20);
  *ppIVar3 = neuronPtr;
  if (neuronType == OUTPUT) {
    __position._M_current =
         (this->output).super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current !=
        (this->output).super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      *__position._M_current = local_28;
      pppIVar2 = &(this->output).super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppIVar2 = *pppIVar2 + 1;
      return;
    }
    this_00 = (vector<INeuron*,std::allocator<INeuron*>> *)&this->output;
  }
  else {
    if (neuronType != INPUT) {
      return;
    }
    __position._M_current =
         (this->input).super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current !=
        (this->input).super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      *__position._M_current = local_28;
      pppIVar2 = &(this->input).super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppIVar2 = *pppIVar2 + 1;
      return;
    }
    this_00 = (vector<INeuron*,std::allocator<INeuron*>> *)&this->input;
  }
  std::vector<INeuron*,std::allocator<INeuron*>>::_M_realloc_insert<INeuron*const&>
            (this_00,__position,&local_28);
  return;
}

Assistant:

void INetwork::AddNeuron( INeuron *neuronPtr, size_t neuronId, SPIKING_NN::NEURON_TYPE neuronType )
{
    if ( neuronMap.find( neuronId ) == neuronMap.end()) {
        neuronMap[neuronId] = neuronPtr;
        if ( neuronType == SPIKING_NN::NEURON_TYPE::INPUT ) {
            input.push_back( neuronPtr );
        } else if ( neuronType == SPIKING_NN::NEURON_TYPE::OUTPUT ) {
            output.push_back( neuronPtr );
        }
    }
}